

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

void __thiscall
chrono::ChArchiveExplorer::PrepareSearch(ChArchiveExplorer *this,string *msearched_property)

{
  istream *piVar1;
  string segment;
  stringstream test;
  
  ClearSearch(this);
  std::__cxx11::string::_M_assign((string *)&this->searched_property);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&test,(string *)msearched_property,_S_out|_S_in);
  segment._M_dataplus._M_p = (pointer)&segment.field_2;
  segment._M_string_length = 0;
  segment.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&test,(string *)&segment,'/');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->search_tokens,&segment);
  }
  std::__cxx11::string::~string((string *)&segment);
  std::__cxx11::stringstream::~stringstream((stringstream *)&test);
  return;
}

Assistant:

void PrepareSearch(const std::string& msearched_property) {
        ClearSearch();
        this->searched_property = msearched_property;
        std::stringstream test(msearched_property);
        std::string segment;
        
        while (std::getline(test, segment, '/')) {
            search_tokens.push_back(segment);
        }
    }